

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall unitStrings_nan_Test::TestBody(unitStrings_nan_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unit_data uVar2;
  precise_unit *ppVar3;
  uint64_t uVar4;
  uint64_t in_RCX;
  string *__return_storage_ptr__;
  string *__return_storage_ptr___00;
  pointer *__ptr;
  char *pcVar5;
  char *in_R9;
  double dVar6;
  precise_unit pVar7;
  string res;
  precise_unit nanunit;
  AssertHelper local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  undefined1 local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  string local_a8;
  double local_88;
  precise_unit local_80;
  string local_70;
  string local_50;
  double local_30;
  undefined8 local_28;
  
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  __return_storage_ptr__ = &local_a8;
  units::to_string_abi_cxx11_(__return_storage_ptr__,(units *)units::precise::error,ppVar3,in_RCX);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            ((internal *)local_c8,"to_string(precise::error)","\"ERROR\"",__return_storage_ptr__,
             (char (*) [6])0x1fa9d0);
  paVar1 = &local_a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_c0->_M_dataplus)._M_p;
    }
    __return_storage_ptr__ = (string *)0x10e;
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x10e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  __return_storage_ptr___00 = &local_a8;
  units::to_string_abi_cxx11_
            (__return_storage_ptr___00,(units *)units::precise::invalid,ppVar3,
             (uint64_t)__return_storage_ptr__);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
            ((internal *)local_c8,"to_string(precise::invalid)","\"NaN*ERROR\"",
             __return_storage_ptr___00,(char (*) [10])"NaN*ERROR");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_c0->_M_dataplus)._M_p;
    }
    __return_storage_ptr___00 = (string *)0x110;
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x110,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_30 = NAN;
  local_28 = 0;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_
            (&local_a8,(units *)&local_30,ppVar3,(uint64_t)__return_storage_ptr___00);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_c8,"res","\"NaN\"",&local_a8,(char (*) [4])0x20b33d);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x114,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
    if (local_e8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e8.data_ + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_a8._M_dataplus._M_p,
             local_a8._M_dataplus._M_p + local_a8._M_string_length);
  uVar4 = units::getDefaultFlags();
  pVar7 = units::unit_from_string(&local_50,uVar4);
  dVar6 = pVar7.multiplier_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    local_88 = pVar7.multiplier_;
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    dVar6 = local_88;
  }
  local_e8.data_._0_1_ = (internal)NAN(dVar6);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!NAN(dVar6)) {
    testing::Message::Message((Message *)local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)&local_e8,(AssertionResult *)"isnan(nanresult)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x116,(char *)CONCAT71(local_c8._1_7_,local_c8[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_c8._1_7_,local_c8[0]) != &local_b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8._M_allocated_capacity + 1);
    }
    if (local_d8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d8 + 8))();
    }
    if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e0,local_e0);
    }
  }
  local_88 = local_30;
  local_80.base_units_ =
       units::detail::unit_data::operator*
                 ((unit_data *)&local_28,(unit_data *)(units::precise::m + 8));
  uVar4 = (ulong)local_28._4_4_ << 0x20;
  local_80.commodity_ = local_28._4_4_;
  local_80.multiplier_ = local_88;
  _local_d8 = units::precise_unit::operator/(&local_80,(precise_unit *)units::precise::s);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)local_c8,(units *)local_d8,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[8]>
            ((internal *)&local_e8,"to_string(nanunit * precise::m / precise::s)","\"NaN*m/s\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
             (char (*) [8])"NaN*m/s");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_c8._1_7_,local_c8[0]) != &local_b8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8._M_allocated_capacity + 1);
  }
  if (local_e8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x117,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
    if ((long *)CONCAT71(local_c8._1_7_,local_c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_c8._1_7_,local_c8[0]) + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  uVar2 = units::detail::unit_data::operator/
                    ((unit_data *)((long)&units::m + 4),(unit_data *)((long)&units::s + 4));
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_e8.data_ = (AssertHelperData *)0x7ffc000000000000;
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)(uint)uVar2
  ;
  units::to_string_abi_cxx11_((string *)local_c8,(units *)&local_e8,ppVar3,0x7ffc000000000000);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[8]>
            ((internal *)local_d8,
             "to_string(unit(std::numeric_limits<double>::signaling_NaN(), m / s))","\"NaN*m/s\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
             (char (*) [8])"NaN*m/s");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_c8._1_7_,local_c8[0]) != &local_b8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8._M_allocated_capacity + 1);
  }
  if (local_d8[0] == (units)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_d0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x11b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((long *)CONCAT71(local_c8._1_7_,local_c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_c8._1_7_,local_c8[0]) + 8))();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_d8 + 8),local_d0);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NaN*m/s","");
  uVar4 = units::getDefaultFlags();
  pVar7 = units::unit_from_string(&local_70,uVar4);
  local_88 = pVar7.multiplier_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_e8.data_._0_4_ = pVar7.base_units_;
  pVar7 = units::precise_unit::operator/
                    ((precise_unit *)units::precise::m,(precise_unit *)units::precise::s);
  local_d8._0_4_ = pVar7.base_units_;
  testing::internal::CmpHelperEQ<units::detail::unit_data,units::detail::unit_data>
            ((internal *)local_c8,"retunit.base_units()","(precise::m / precise::s).base_units()",
             (unit_data *)&local_e8,(unit_data *)local_d8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x11d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
    if (local_e8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e8.data_ + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_e8.data_._0_1_ = (internal)NAN(local_88);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!NAN(local_88)) {
    testing::Message::Message((Message *)local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)&local_e8,(AssertionResult *)"isnan(retunit)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x11e,(char *)CONCAT71(local_c8._1_7_,local_c8[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_c8._1_7_,local_c8[0]) != &local_b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8._M_allocated_capacity + 1);
    }
    if (local_d8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d8 + 8))();
    }
    if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e0,local_e0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(unitStrings, nan)
{
    EXPECT_EQ(to_string(precise::error), "ERROR");

    EXPECT_EQ(to_string(precise::invalid), "NaN*ERROR");
    auto nanunit =
        precise_unit(std::numeric_limits<double>::quiet_NaN(), precise::one);
    auto res = to_string(nanunit);
    EXPECT_EQ(res, "NaN");
    auto nanresult = unit_from_string(res);
    EXPECT_TRUE(isnan(nanresult));
    EXPECT_EQ(to_string(nanunit * precise::m / precise::s), "NaN*m/s");

    EXPECT_EQ(
        to_string(unit(std::numeric_limits<double>::signaling_NaN(), m / s)),
        "NaN*m/s");
    auto retunit = unit_from_string("NaN*m/s");
    EXPECT_EQ(retunit.base_units(), (precise::m / precise::s).base_units());
    EXPECT_TRUE(isnan(retunit));
}